

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLEBABecLap::prepareForSolve(MLEBABecLap *this)

{
  bool bVar1;
  LinOpBCType *pLVar2;
  iterator pvVar3;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *this_00;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *pvVar4;
  int *piVar5;
  uint *puVar6;
  size_type in_RDI;
  Real RVar7;
  Real RVar8;
  Real amax;
  Real asum;
  int alev;
  LinOpBCType *ithi;
  LinOpBCType *itlo;
  int amrlev;
  bool in_stack_000000d3;
  int in_stack_000000d4;
  MultiFab *in_stack_000000d8;
  undefined1 in_stack_000002ae;
  undefined1 in_stack_000002af;
  int in_stack_000002b0;
  int in_stack_000002b4;
  MultiFab *in_stack_000002b8;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *in_stack_ffffffffffffff90;
  LinOpBCType *in_stack_ffffffffffffffa0;
  MultiFab *in_stack_ffffffffffffffa8;
  type in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int local_30;
  int local_c;
  
  MLCellABecLap::prepareForSolve((MLCellABecLap *)0x14e3dd8);
  averageDownCoeffs((MLEBABecLap *)itlo);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14e3dff
                    );
  if (bVar1) {
    local_c = *(int *)(in_RDI + 0x34);
    while (local_c = local_c + -1, 0 < local_c) {
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffffb0 =
           std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      in_stack_ffffffffffffff90);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffff90);
      EB_average_down_boundaries
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
    }
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x14e3e95);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffc0,in_RDI,(value_type *)in_stack_ffffffffffffffb0);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[](in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x14e3ed7);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[](in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x14e3ef9);
  pLVar2 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                     ((LinOpBCType *)in_stack_ffffffffffffffb0,
                      (LinOpBCType *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[](in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pvVar3 = std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x14e3f35);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[](in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x14e3f57);
  this_00 = (vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
            std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                      ((LinOpBCType *)in_stack_ffffffffffffffb0,
                       (LinOpBCType *)in_stack_ffffffffffffffa8,pvVar3);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[](in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pvVar3 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x14e3f9d);
  if (pLVar2 == pvVar3) {
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pvVar4 = (vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
             std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x14e3fd5);
    if ((this_00 == pvVar4) && (bVar1 = isEBDirichlet((MLEBABecLap *)0x14e3ff0), !bVar1)) {
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x34); local_30 = local_30 + 1) {
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)this_00,
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (*piVar5 != 0) {
          if ((*(double *)(in_RDI + 0x330) != 0.0) || (NAN(*(double *)(in_RDI + 0x330)))) {
            Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          *)this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back(this_00);
            RVar7 = MultiFab::sum(in_stack_000000d8,in_stack_000000d4,in_stack_000000d3);
            Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          *)this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back(this_00);
            RVar8 = MultiFab::norm0(in_stack_000002b8,in_stack_000002b4,in_stack_000002b0,
                                    (bool)in_stack_000002af,(bool)in_stack_000002ae);
            bVar1 = RVar7 <= RVar8 * 1e-12;
            in_stack_ffffffffffffff8c = (uint)bVar1;
            puVar6 = (uint *)Vector<int,_std::allocator<int>_>::operator[]
                                       ((Vector<int,_std::allocator<int>_> *)this_00,
                                        (ulong)CONCAT14(bVar1,in_stack_ffffffffffffff88));
            *puVar6 = in_stack_ffffffffffffff8c;
          }
          else {
            piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)this_00,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            *piVar5 = 1;
          }
        }
      }
    }
  }
  *(undefined1 *)(in_RDI + 0x324) = 0;
  return;
}

Assistant:

void
MLEBABecLap::prepareForSolve ()
{
    BL_PROFILE("MLABecLaplacian::prepareForSolve()");

    MLCellABecLap::prepareForSolve();

    averageDownCoeffs();

    if (m_eb_phi[0]) {
        for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev) {
            amrex::EB_average_down_boundaries(*m_eb_phi[amrlev], *m_eb_phi[amrlev-1],
                                              mg_coarsen_ratio, 0);
        }
    }

    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end() && !isEBDirichlet())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            if (m_domain_covered[alev])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (asum <= amax * 1.e-12);
                }
            }
        }
    }

    m_needs_update = false;
}